

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

Bbl_Man_t * Bbl_ManReadBinaryBlif(char *pFileName)

{
  int iVar1;
  char *pcVar2;
  Vec_Str_t *pVVar3;
  Vec_Int_t *pVVar4;
  bool bVar5;
  int local_2c;
  char *pcStack_28;
  int h;
  char *pBuffer;
  Bbl_Obj_t *pObj;
  Bbl_Man_t *p;
  char *pFileName_local;
  
  p = (Bbl_Man_t *)pFileName;
  pObj = (Bbl_Obj_t *)malloc(0x4d0);
  memset(pObj,0,0x4d0);
  iVar1 = Bbl_ManFileSize((char *)p);
  pObj[4].Id = iVar1;
  pcVar2 = Bbl_ManFileRead((char *)p);
  *(char **)&pObj[4].field_0x8 = pcVar2;
  pcStack_28 = *(char **)&pObj[4].field_0x8;
  pVVar3 = Vec_StrRead(&stack0xffffffffffffffd8);
  *(Vec_Str_t **)pObj = pVVar3;
  pVVar3 = Vec_StrRead(&stack0xffffffffffffffd8);
  *(Vec_Str_t **)&pObj->field_0x8 = pVVar3;
  pVVar3 = Vec_StrRead(&stack0xffffffffffffffd8);
  *(Vec_Str_t **)&pObj[1].Fnc = pVVar3;
  if ((long)pcStack_28 - *(long *)&pObj[4].field_0x8 == (long)pObj[4].Id) {
    pVVar4 = Vec_IntAlloc(1000);
    *(Vec_Int_t **)&pObj[2].field_0x8 = pVVar4;
    local_2c = 0;
    while( true ) {
      bVar5 = false;
      if (local_2c < *(int *)(*(long *)&pObj->field_0x8 + 4)) {
        pBuffer = (char *)Bbl_VecObj(*(Vec_Str_t **)&pObj->field_0x8,local_2c);
        bVar5 = (Bbl_Obj_t *)pBuffer != (Bbl_Obj_t *)0x0;
      }
      if (!bVar5) break;
      Vec_IntPush(*(Vec_Int_t **)&pObj[2].field_0x8,*(int *)pBuffer);
      iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj[2].field_0x8);
      *(int *)pBuffer = iVar1 + -1;
      iVar1 = Bbl_ObjSize((Bbl_Obj_t *)pBuffer);
      local_2c = iVar1 + local_2c;
    }
    return (Bbl_Man_t *)pObj;
  }
  __assert_fail("pBuffer - p->pFileData == p->nFileSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                ,0x2d7,"Bbl_Man_t *Bbl_ManReadBinaryBlif(char *)");
}

Assistant:

Bbl_Man_t * Bbl_ManReadBinaryBlif( char * pFileName )
{
    Bbl_Man_t * p;
    Bbl_Obj_t * pObj;
    char * pBuffer;
    int h;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    p->nFileSize = Bbl_ManFileSize( pFileName );
    p->pFileData = Bbl_ManFileRead( pFileName );
    // extract three managers
    pBuffer = p->pFileData;
    p->pName = Vec_StrRead( &pBuffer );
    p->pObjs = Vec_StrRead( &pBuffer );
    p->pFncs = Vec_StrRead( &pBuffer );
    assert( pBuffer - p->pFileData == p->nFileSize );
    // remember original IDs in the objects
    p->vObj2Id = Vec_IntAlloc( 1000 );
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        Vec_IntPush( p->vObj2Id, pObj->Id );
        pObj->Id = Vec_IntSize(p->vObj2Id) - 1; 
    }
    return p;
}